

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O2

void ssw_strip(char **str)

{
  ulong uVar1;
  char *__s;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  __s = *str;
  sVar2 = strlen(__s);
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    uVar1 = uVar3 + 1;
  } while (__s[uVar3] == ' ');
  if (uVar1 != 1) {
    memmove(__s,__s + uVar3,(sVar2 - uVar1) + 2);
  }
  if (uVar3 < sVar2) {
    lVar4 = sVar2 - uVar1;
    do {
      if ((*str)[lVar4] != ' ') {
        return;
      }
      (*str)[lVar4] = '\0';
      bVar5 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while (bVar5);
  }
  return;
}

Assistant:

void ssw_strip(char **str) {
  size_t l = strlen(*str);
  size_t i = 0;
  while ((*str)[i]==' ')
    ++i;
  if (i)
    memmove(*str,*str+i,l+1-i);
  if ( l <= i )
    return;
  i = (size_t)((l-i)-1);
  while ( (*str)[i]==' ' ) {
    (*str)[i]='\0';
    if (!i)
      break;
    --i;
  }
}